

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 451.test.cpp
# Opt level: O3

void verifyChunk(Type<7,_451> *chunk)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  member_size_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  n;
  ElementInformation *entry;
  pointer pEVar4;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_240;
  undefined1 local_1f8 [8];
  undefined8 local_1f0;
  char *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [2];
  undefined1 local_1c0 [9];
  bool bStack_1b7;
  undefined6 uStack_1b6;
  ITransientExpression *local_1b0;
  WithinRelMatcher *local_1a8;
  long local_1a0;
  ITransientExpression local_198;
  iterator_t<CRng> *local_188;
  WithinRelMatcher *local_180;
  iterator_t<CRng> local_178;
  undefined1 *local_170;
  double local_168;
  iterator_t<CRng> local_160;
  undefined1 *local_158;
  iterator_t<CRng> local_150;
  undefined1 *local_148;
  iterator_t<CRng> local_140;
  undefined1 *local_138;
  iterator_t<CRng> local_130;
  undefined1 *local_128;
  iterator_t<CRng> local_120;
  undefined1 *local_118;
  iterator_t<CRng> local_110;
  undefined1 *local_108;
  iterator_t<CRng> local_100;
  undefined1 *local_f8;
  iterator_t<CRng> local_f0;
  undefined1 *local_e8;
  iterator_t<CRng> local_e0;
  undefined1 *local_d8;
  iterator_t<CRng> local_d0;
  undefined1 *local_c8;
  iterator_t<CRng> local_c0;
  undefined1 *local_b8;
  iterator_t<CRng> local_b0;
  undefined1 *local_a8;
  iterator_t<CRng> local_a0;
  undefined1 *local_98;
  iterator_t<CRng> local_90;
  undefined1 *local_88;
  iterator_t<CRng> local_80;
  undefined1 *local_78;
  iterator_t<CRng> local_70;
  undefined1 *local_68;
  iterator_t<CRng> local_60;
  undefined1 *local_58;
  iterator_t<CRng> local_50;
  undefined1 *local_48;
  iterator_t<CRng> local_40;
  undefined1 *local_38;
  
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x8a;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "451 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName,(SourceLineInfo *)local_1f8,capturedExpression,ContinueOnFailure);
  local_1f0._0_2_ = 0x101;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 0x1c3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = 0x1c3;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x8b;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "451 == chunk.sectionNumber()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_00,(SourceLineInfo *)local_1f8,capturedExpression_00,
             ContinueOnFailure);
  local_1f0._0_2_ = 0x101;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 0x1c3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = 0x1c3;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x8d;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "122 == chunk.ZA()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_01,(SourceLineInfo *)local_1f8,capturedExpression_01,
             ContinueOnFailure);
  iVar2 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_;
  local_1f0._1_1_ = iVar2 == 0x7a;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 0x7a;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x8e;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1f;
  capturedExpression_02.m_start = "122 == chunk.targetIdentifier()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_02,(SourceLineInfo *)local_1f8,capturedExpression_02,
             ContinueOnFailure);
  iVar2 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).ZA_;
  local_1f0._1_1_ = iVar2 == 0x7a;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 0x7a;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x8f;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x1d;
  capturedExpression_03.m_start = "15., WithinRel( chunk.AWR() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_03,(SourceLineInfo *)local_1f8,capturedExpression_03,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x402e000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x90;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x2b;
  capturedExpression_04.m_start = "15., WithinRel( chunk.atomicWeightRatio() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_04,(SourceLineInfo *)local_1f8,capturedExpression_04,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x402e000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<7,_451>_>).atomicWeightRatio_);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x91;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xf;
  capturedExpression_05.m_start = "1 == chunk.NA()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_05,(SourceLineInfo *)local_1f8,capturedExpression_05,
             ContinueOnFailure);
  iVar2 = (int)((ulong)((long)(chunk->elements_).
                              super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->elements_).
                             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  local_1f0._1_1_ = iVar2 == 1;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6320;
  local_1f0._4_4_ = 1;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x92;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1b;
  capturedExpression_06.m_start = "1 == chunk.numberElements()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_06,(SourceLineInfo *)local_1f8,capturedExpression_06,
             ContinueOnFailure);
  iVar2 = (int)((ulong)((long)(chunk->elements_).
                              super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(chunk->elements_).
                             super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  local_1f0._1_1_ = iVar2 == 1;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6320;
  local_1f0._4_4_ = 1;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x94;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x1c;
  capturedExpression_07.m_start = "1 == chunk.elements().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_07,(SourceLineInfo *)local_1f8,capturedExpression_07,
             ContinueOnFailure);
  lVar3 = (long)(chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_1e0[0]._8_8_ = (lVar3 >> 3) * -0x71c71c71c71c71c7;
  local_1f0._1_1_ = lVar3 == 0x48;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 1;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x96;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "2 == chunk.elements()[0].NAS()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_08,(SourceLineInfo *)local_1f8,capturedExpression_08,
             ContinueOnFailure);
  iVar2 = (int)(((chunk->elements_).
                 super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_1f0._1_1_ = iVar2 == 2;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 2;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x97;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x26;
  capturedExpression_09.m_start = "2 == chunk.elements()[0].numberAtoms()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_09,(SourceLineInfo *)local_1f8,capturedExpression_09,
             ContinueOnFailure);
  iVar2 = (int)(((chunk->elements_).
                 super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_1f0._1_1_ = iVar2 == 2;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 2;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x98;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1d;
  capturedExpression_10.m_start = "3 == chunk.elements()[0].NI()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_10,(SourceLineInfo *)local_1f8,capturedExpression_10,
             ContinueOnFailure);
  iVar2 = *(int *)&(((chunk->elements_).
                     super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields;
  local_1f0._1_1_ = iVar2 == 3;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x99;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x29;
  capturedExpression_11.m_start = "3 == chunk.elements()[0].numberIsotopes()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_11,(SourceLineInfo *)local_1f8,capturedExpression_11,
             ContinueOnFailure);
  iVar2 = *(int *)&(((chunk->elements_).
                     super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields;
  local_1f0._1_1_ = iVar2 == 3;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d62a0;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  local_1e0[0]._8_4_ = iVar2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x9b;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x25;
  capturedExpression_12.m_start = "3 == chunk.elements()[0].ZAI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_12,(SourceLineInfo *)local_1f8,capturedExpression_12,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          *(long *)&(pEVar4->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x9c;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x34;
  capturedExpression_13.m_start = "3 == chunk.elements()[0].isotopeIdentifiers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_13,(SourceLineInfo *)local_1f8,capturedExpression_13,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          *(long *)&(pEVar4->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x9d;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x26;
  capturedExpression_14.m_start = "3 == chunk.elements()[0].LISI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_14,(SourceLineInfo *)local_1f8,capturedExpression_14,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - *(long *)&(pEVar4->super_ListRecord).data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x9e;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x30;
  capturedExpression_15.m_start = "3 == chunk.elements()[0].isomericStates().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_15,(SourceLineInfo *)local_1f8,capturedExpression_15,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - *(long *)&(pEVar4->super_ListRecord).data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0x9f;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x25;
  capturedExpression_16.m_start = "3 == chunk.elements()[0].AFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_16,(SourceLineInfo *)local_1f8,capturedExpression_16,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa0;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x2c;
  capturedExpression_17.m_start = "3 == chunk.elements()[0].abundances().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_17,(SourceLineInfo *)local_1f8,capturedExpression_17,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa1;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x26;
  capturedExpression_18.m_start = "3 == chunk.elements()[0].AWRI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_18,(SourceLineInfo *)local_1f8,capturedExpression_18,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa2;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x34;
  capturedExpression_19.m_start = "3 == chunk.elements()[0].atomicWeightRatios().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_19,(SourceLineInfo *)local_1f8,capturedExpression_19,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa3;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x25;
  capturedExpression_20.m_start = "3 == chunk.elements()[0].SFI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_20,(SourceLineInfo *)local_1f8,capturedExpression_20,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa4;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x3d;
  capturedExpression_21.m_start = "3 == chunk.elements()[0].freeScatteringCrossSections().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_21,(SourceLineInfo *)local_1f8,capturedExpression_21,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - *(long *)&(pEVar4->super_ListRecord).data.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data) >> 3;
  local_1e0[0]._8_8_ = (lVar3 + 5U) / 6;
  local_1f0._1_1_ = lVar3 - 0xdU < 6;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d6360;
  local_1f0._4_4_ = 3;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa5;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x24;
  capturedExpression_22.m_start = "8016 == chunk.elements()[0].ZAI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_22,(SourceLineInfo *)local_1f8,capturedExpression_22,
             ContinueOnFailure);
  local_1e0[0]._8_8_ =
       *(((chunk->elements_).
          super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8016.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f50;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa6;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x24;
  capturedExpression_23.m_start = "8017 == chunk.elements()[0].ZAI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_23,(SourceLineInfo *)local_1f8,capturedExpression_23,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = *(ITransientExpression **)
               &(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_158 = local_1c0;
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_160._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_158,&local_160,1);
  local_1e0[0]._8_8_ = *local_160._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8017.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f51;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa7;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x24;
  capturedExpression_24.m_start = "8018 == chunk.elements()[0].ZAI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_24,(SourceLineInfo *)local_1f8,capturedExpression_24,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = *(ITransientExpression **)
               &(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_148 = local_1c0;
  local_150._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_148,&local_150,2);
  local_1e0[0]._8_8_ = *local_150._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8018.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f52;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa8;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x33;
  capturedExpression_25.m_start = "8016 == chunk.elements()[0].isotopeIdentifiers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_25,(SourceLineInfo *)local_1f8,capturedExpression_25,
             ContinueOnFailure);
  local_1e0[0]._8_8_ =
       *(((chunk->elements_).
          super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8016.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f50;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xa9;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x33;
  capturedExpression_26.m_start = "8017 == chunk.elements()[0].isotopeIdentifiers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_26,(SourceLineInfo *)local_1f8,capturedExpression_26,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = *(ITransientExpression **)
               &(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_138 = local_1c0;
  local_140._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_138,&local_140,1);
  local_1e0[0]._8_8_ = *local_140._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8017.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f51;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xaa;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x33;
  capturedExpression_27.m_start = "8018 == chunk.elements()[0].isotopeIdentifiers()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_27,(SourceLineInfo *)local_1f8,capturedExpression_27,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b0 = *(ITransientExpression **)
               &(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_128 = local_1c0;
  local_130._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_128,&local_130,2);
  local_1e0[0]._8_8_ = *local_130._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 8018.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0._4_4_ = 0x1f52;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xab;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x22;
  capturedExpression_28.m_start = "0 == chunk.elements()[0].LISI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_28,(SourceLineInfo *)local_1f8,capturedExpression_28,
             ContinueOnFailure);
  local_1e0[0]._8_8_ =
       *(double *)
        (*(long *)&(((chunk->elements_).
                     super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xac;
  macroName_29.m_size = 5;
  macroName_29.m_start = "CHECK";
  capturedExpression_29.m_size = 0x22;
  capturedExpression_29.m_start = "0 == chunk.elements()[0].LISI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_29,(SourceLineInfo *)local_1f8,capturedExpression_29,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_118 = local_1c0;
  local_120._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_118,&local_120,1);
  local_1e0[0]._8_8_ = *local_120._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xad;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x22;
  capturedExpression_30.m_start = "0 == chunk.elements()[0].LISI()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_30,(SourceLineInfo *)local_1f8,capturedExpression_30,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_108 = local_1c0;
  local_110._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_108,&local_110,2);
  local_1e0[0]._8_8_ = *local_110._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xae;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x2c;
  capturedExpression_31.m_start = "0 == chunk.elements()[0].isomericStates()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_31,(SourceLineInfo *)local_1f8,capturedExpression_31,
             ContinueOnFailure);
  local_1e0[0]._8_8_ =
       *(double *)
        (*(long *)&(((chunk->elements_).
                     super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xaf;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x2c;
  capturedExpression_32.m_start = "0 == chunk.elements()[0].isomericStates()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_32,(SourceLineInfo *)local_1f8,capturedExpression_32,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_f8 = local_1c0;
  local_100._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_f8,&local_100,1);
  local_1e0[0]._8_8_ = *local_100._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb0;
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  capturedExpression_33.m_size = 0x2c;
  capturedExpression_33.m_start = "0 == chunk.elements()[0].isomericStates()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_33,(SourceLineInfo *)local_1f8,capturedExpression_33,
             ContinueOnFailure);
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_e8 = local_1c0;
  local_f0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_e8,&local_f0,2);
  local_1e0[0]._8_8_ = *local_f0._M_current;
  local_1f0._1_1_ = (double)local_1e0[0]._8_8_ == 0.0;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63a0;
  local_1f0 = local_1f0 & 0xffffffff;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb1;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x36;
  capturedExpression_34.m_start = "9.976200e-1, WithinRel( chunk.elements()[0].AFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_34,(SourceLineInfo *)local_1f8,capturedExpression_34,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x3fefec80c73abc94;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb2;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x36;
  capturedExpression_35.m_start = "3.800000e-4, WithinRel( chunk.elements()[0].AFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_35,(SourceLineInfo *)local_1f8,capturedExpression_35,
             ContinueOnFailure);
  local_178._M_current = (double *)0x3f38e757928e0c9e;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_d8 = local_1c0;
  local_e0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d8,&local_e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_e0._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb3;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x36;
  capturedExpression_36.m_start = "2.000000e-3, WithinRel( chunk.elements()[0].AFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_36,(SourceLineInfo *)local_1f8,capturedExpression_36,
             ContinueOnFailure);
  local_178._M_current = (double *)0x3f60624dd2f1a9fc;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_c8 = local_1c0;
  local_d0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_c8,&local_d0,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_d0._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb4;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x3d;
  capturedExpression_37.m_start = "9.976200e-1, WithinRel( chunk.elements()[0].abundances()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_37,(SourceLineInfo *)local_1f8,capturedExpression_37,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x3fefec80c73abc94;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb5;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x3d;
  capturedExpression_38.m_start = "3.800000e-4, WithinRel( chunk.elements()[0].abundances()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_38,(SourceLineInfo *)local_1f8,capturedExpression_38,
             ContinueOnFailure);
  local_178._M_current = (double *)0x3f38e757928e0c9e;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_b8 = local_1c0;
  local_c0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b8,&local_c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_c0._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb6;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x3d;
  capturedExpression_39.m_start = "2.000000e-3, WithinRel( chunk.elements()[0].abundances()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_39,(SourceLineInfo *)local_1f8,capturedExpression_39,
             ContinueOnFailure);
  local_178._M_current = (double *)0x3f60624dd2f1a9fc;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x10);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_a8 = local_1c0;
  local_b0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_a8,&local_b0,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_b0._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb7;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x34;
  capturedExpression_40.m_start = "15.85751, WithinRel( chunk.elements()[0].AWRI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_40,(SourceLineInfo *)local_1f8,capturedExpression_40,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x402fb70b8cfbfc65;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb8;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x34;
  capturedExpression_41.m_start = "16.85310, WithinRel( chunk.elements()[0].AWRI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_41,(SourceLineInfo *)local_1f8,capturedExpression_41,
             ContinueOnFailure);
  local_178._M_current = (double *)0x4030da64c2f837b5;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_98 = local_1c0;
  local_a0._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_98,&local_a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_a0._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xb9;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x34;
  capturedExpression_42.m_start = "17.84450, WithinRel( chunk.elements()[0].AWRI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_42,(SourceLineInfo *)local_1f8,capturedExpression_42,
             ContinueOnFailure);
  local_178._M_current = (double *)0x4031d83126e978d5;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_88 = local_1c0;
  local_90._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_90,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_90._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xba;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x42;
  capturedExpression_43.m_start =
       "15.85751, WithinRel( chunk.elements()[0].atomicWeightRatios()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_43,(SourceLineInfo *)local_1f8,capturedExpression_43,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x402fb70b8cfbfc65;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xbb;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x42;
  capturedExpression_44.m_start =
       "16.85310, WithinRel( chunk.elements()[0].atomicWeightRatios()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_44,(SourceLineInfo *)local_1f8,capturedExpression_44,
             ContinueOnFailure);
  local_178._M_current = (double *)0x4030da64c2f837b5;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_78 = local_1c0;
  local_80._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_78,&local_80,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_80._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xbc;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x42;
  capturedExpression_45.m_start =
       "17.84450, WithinRel( chunk.elements()[0].atomicWeightRatios()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_45,(SourceLineInfo *)local_1f8,capturedExpression_45,
             ContinueOnFailure);
  local_178._M_current = (double *)0x4031d83126e978d5;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x18);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_68 = local_1c0;
  local_70._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_68,&local_70,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_70._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xbd;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x33;
  capturedExpression_46.m_start = "3.744801, WithinRel( chunk.elements()[0].SFI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_46,(SourceLineInfo *)local_1f8,capturedExpression_46,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x400df55a3a08398a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xbe;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x33;
  capturedExpression_47.m_start = "3.642671, WithinRel( chunk.elements()[0].SFI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_47,(SourceLineInfo *)local_1f8,capturedExpression_47,
             ContinueOnFailure);
  local_178._M_current = (double *)0x400d2430b178b370;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_58 = local_1c0;
  local_60._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_60._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xbf;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x33;
  capturedExpression_48.m_start = "3.846775, WithinRel( chunk.elements()[0].SFI()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_48,(SourceLineInfo *)local_1f8,capturedExpression_48,
             ContinueOnFailure);
  local_178._M_current = (double *)0x400ec631f8a0902e;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_48 = local_1c0;
  local_50._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_48,&local_50,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_50._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xc0;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x4b;
  capturedExpression_49.m_start =
       "3.744801, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_49,(SourceLineInfo *)local_1f8,capturedExpression_49,
             ContinueOnFailure);
  local_198._vptr_ITransientExpression = (_func_int **)0x400df55a3a08398a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_1f8,
             *(double *)
              (*(long *)&(((chunk->elements_).
                           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20));
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_1f8,(double *)&local_198);
  bStack_1b7 = bVar1;
  local_1c0[8] = true;
  local_1c0._0_8_ = &PTR_streamReconstructedExpression_001d62e0;
  local_1b0 = &local_198;
  local_1a8 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1c0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xc1;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x4b;
  capturedExpression_50.m_start =
       "3.642671, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_50,(SourceLineInfo *)local_1f8,capturedExpression_50,
             ContinueOnFailure);
  local_178._M_current = (double *)0x400d2430b178b370;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_38 = local_1c0;
  local_40._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_38,&local_40,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_40._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,(double *)&local_178);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = &local_178;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xc2;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x4b;
  capturedExpression_51.m_start =
       "3.846775, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_51,(SourceLineInfo *)local_1f8,capturedExpression_51,
             ContinueOnFailure);
  local_168 = 3.846775;
  pEVar4 = (chunk->elements_).
           super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1b0 = (ITransientExpression *)
              (*(long *)&(pEVar4->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 0x20);
  local_1a8 = (WithinRelMatcher *)0x6;
  lVar3 = ((long)unique0x00012000 - (long)local_1b0 >> 3) % 6;
  local_1a0 = 6 - lVar3;
  if (lVar3 == 0) {
    local_1a0 = 0;
  }
  local_170 = local_1c0;
  local_178._M_current = (double *)local_1b0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_170,&local_178,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_1f8,*local_178._M_current);
  local_198.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_1f8,&local_168);
  local_198.m_isBinaryExpression = true;
  local_198._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d62e0;
  local_188 = (iterator_t<CRng> *)&local_168;
  local_180 = (WithinRelMatcher *)local_1f8;
  Catch::AssertionHandler::handleExpr(&local_240,&local_198);
  Catch::ITransientExpression::~ITransientExpression(&local_198);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_1f8 = (undefined1  [8])0x198488;
  local_1f0 = (pointer)0xc4;
  macroName_52.m_size = 5;
  macroName_52.m_start = "CHECK";
  capturedExpression_52.m_size = 0xf;
  capturedExpression_52.m_start = "5 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_240,macroName_52,(SourceLineInfo *)local_1f8,capturedExpression_52,
             ContinueOnFailure);
  local_1e0[0]._8_8_ = 1;
  for (pEVar4 = (chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar4 != (chunk->elements_).
                super__Vector_base<njoy::ENDFtk::section::Type<7,_451>::ElementInformation,_std::allocator<njoy::ENDFtk::section::Type<7,_451>::ElementInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish; pEVar4 = pEVar4 + 1) {
    local_1e0[0]._8_8_ =
         local_1e0[0]._8_8_ +
         (((long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pEVar4->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  }
  local_1f0._1_1_ = local_1e0[0]._8_8_ == 5;
  local_1f0._0_1_ = true;
  local_1f8 = (undefined1  [8])&PTR_streamReconstructedExpression_001d63e0;
  local_1f0._4_4_ = 5;
  local_1e8 = "==";
  local_1e0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_240,(ITransientExpression *)local_1f8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f8);
  Catch::AssertionHandler::complete(&local_240);
  if (local_240.m_completed == false) {
    (*(local_240.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const section::Type< 7, 451 >& chunk ) {

  CHECK( 451 == chunk.MT() );
  CHECK( 451 == chunk.sectionNumber() );

  CHECK( 122 == chunk.ZA() );
  CHECK( 122 == chunk.targetIdentifier() );
  CHECK_THAT( 15., WithinRel( chunk.AWR() ) );
  CHECK_THAT( 15., WithinRel( chunk.atomicWeightRatio() ) );
  CHECK( 1 == chunk.NA() );
  CHECK( 1 == chunk.numberElements() );

  CHECK( 1 == chunk.elements().size() );

  CHECK( 2 == chunk.elements()[0].NAS() );
  CHECK( 2 == chunk.elements()[0].numberAtoms() );
  CHECK( 3 == chunk.elements()[0].NI() );
  CHECK( 3 == chunk.elements()[0].numberIsotopes() );

  CHECK( 3 == chunk.elements()[0].ZAI().size() );
  CHECK( 3 == chunk.elements()[0].isotopeIdentifiers().size() );
  CHECK( 3 == chunk.elements()[0].LISI().size() );
  CHECK( 3 == chunk.elements()[0].isomericStates().size() );
  CHECK( 3 == chunk.elements()[0].AFI().size() );
  CHECK( 3 == chunk.elements()[0].abundances().size() );
  CHECK( 3 == chunk.elements()[0].AWRI().size() );
  CHECK( 3 == chunk.elements()[0].atomicWeightRatios().size() );
  CHECK( 3 == chunk.elements()[0].SFI().size() );
  CHECK( 3 == chunk.elements()[0].freeScatteringCrossSections().size() );
  CHECK( 8016 == chunk.elements()[0].ZAI()[0] );
  CHECK( 8017 == chunk.elements()[0].ZAI()[1] );
  CHECK( 8018 == chunk.elements()[0].ZAI()[2] );
  CHECK( 8016 == chunk.elements()[0].isotopeIdentifiers()[0] );
  CHECK( 8017 == chunk.elements()[0].isotopeIdentifiers()[1] );
  CHECK( 8018 == chunk.elements()[0].isotopeIdentifiers()[2] );
  CHECK( 0 == chunk.elements()[0].LISI()[0] );
  CHECK( 0 == chunk.elements()[0].LISI()[1] );
  CHECK( 0 == chunk.elements()[0].LISI()[2] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[0] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[1] );
  CHECK( 0 == chunk.elements()[0].isomericStates()[2] );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.elements()[0].AFI()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.elements()[0].AFI()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.elements()[0].AFI()[2] ) );
  CHECK_THAT( 9.976200e-1, WithinRel( chunk.elements()[0].abundances()[0] ) );
  CHECK_THAT( 3.800000e-4, WithinRel( chunk.elements()[0].abundances()[1] ) );
  CHECK_THAT( 2.000000e-3, WithinRel( chunk.elements()[0].abundances()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.elements()[0].AWRI()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.elements()[0].AWRI()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.elements()[0].AWRI()[2] ) );
  CHECK_THAT(    15.85751, WithinRel( chunk.elements()[0].atomicWeightRatios()[0] ) );
  CHECK_THAT(    16.85310, WithinRel( chunk.elements()[0].atomicWeightRatios()[1] ) );
  CHECK_THAT(    17.84450, WithinRel( chunk.elements()[0].atomicWeightRatios()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.elements()[0].SFI()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.elements()[0].SFI()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.elements()[0].SFI()[2] ) );
  CHECK_THAT(    3.744801, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[0] ) );
  CHECK_THAT(    3.642671, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[1] ) );
  CHECK_THAT(    3.846775, WithinRel( chunk.elements()[0].freeScatteringCrossSections()[2] ) );

  CHECK( 5 == chunk.NC() );
}